

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRandomUniformBlockCase.cpp
# Opt level: O3

void __thiscall
vkt::ubo::RandomUniformBlockCase::generateUniform
          (RandomUniformBlockCase *this,Random *rnd,UniformBlock *block)

{
  uint uVar1;
  deUint32 flags;
  int in_R8D;
  float fVar2;
  float fVar3;
  string name;
  VarType type;
  string local_a0;
  VarType local_80;
  Uniform local_68;
  
  uVar1 = this->m_features;
  ubo::(anonymous_namespace)::genName_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)0x61,'z',(char)this->m_uniformNdx,in_R8D);
  flags = 0;
  generateType(&local_80,this,rnd,0,true);
  if ((uVar1 >> 9 & 1) != 0) {
    fVar2 = deRandom_getFloat(&rnd->m_rnd);
    fVar3 = deRandom_getFloat(&rnd->m_rnd);
    flags = (uint)(fVar3 < 0.15) << 0xc | (uint)(fVar2 < 0.15) << 0xb;
  }
  Uniform::Uniform(&local_68,&local_a0,&local_80,flags);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back
            (&block->m_uniforms,&local_68);
  VarType::~VarType(&local_68.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
    operator_delete(local_68.m_name._M_dataplus._M_p,
                    local_68.m_name.field_2._M_allocated_capacity + 1);
  }
  this->m_uniformNdx = this->m_uniformNdx + 1;
  VarType::~VarType(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RandomUniformBlockCase::generateUniform (de::Random& rnd, UniformBlock& block)
{
	const float		unusedVtxWeight		= 0.15f;
	const float		unusedFragWeight	= 0.15f;
	bool			unusedOk			= (m_features & FEATURE_UNUSED_UNIFORMS) != 0;
	deUint32		flags				= 0;
	std::string		name				= genName('a', 'z', m_uniformNdx);
	VarType			type				= generateType(rnd, 0, true);

	flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
	flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

	block.addUniform(Uniform(name, type, flags));

	m_uniformNdx += 1;
}